

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListIteratorTest_rbegin_rend_forward_Test::
~IntrusiveListIteratorTest_rbegin_rend_forward_Test
          (IntrusiveListIteratorTest_rbegin_rend_forward_Test *this)

{
  IntrusiveListIteratorTest_rbegin_rend_forward_Test *this_local;
  
  ~IntrusiveListIteratorTest_rbegin_rend_forward_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, rbegin_rend_forward) {
  TestForward(list_.rbegin(), list_.rend(), {3, 2, 1});
  TestForward(clist_.rbegin(), clist_.rend(), {3, 2, 1});
}